

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_impl.cpp
# Opt level: O1

void __thiscall raspicam::_private::Private_Impl::Private_Impl(Private_Impl *this)

{
  *(undefined8 *)((long)&(this->callback_data)._mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->callback_data)._mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->callback_data)._mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->callback_data)._mutex.super___mutex_base._M_mutex + 8) = 0;
  (this->callback_data)._mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  ThreadCondition::ThreadCondition(&(this->callback_data).Thcond);
  (this->callback_data).wantToGrab = false;
  this->format = (MMAL_ES_FORMAT_T *)0x0;
  this->camera_video_port = (MMAL_PORT_T *)0x0;
  (this->callback_data).pstate = (RASPIVID_STATE *)0x0;
  (this->callback_data)._buffData.data = (uchar *)0x0;
  (this->callback_data)._buffData.size = 0;
  this->_isOpened = false;
  this->_isCapturing = false;
  setDefaultStateParams(this);
  return;
}

Assistant:

Private_Impl::Private_Impl() {
            camera_video_port = NULL;
//             camera_still_port = NULL;
            _isOpened=false;
            _isCapturing=false;
            //set default state params
            setDefaultStateParams();
        }